

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

MPP_RET fps_calc_inc(FpsCalc ctx)

{
  long lVar1;
  long lVar2;
  FpsCalcImpl *impl;
  long lVar3;
  long lVar4;
  long lVar5;
  
  if (ctx == (FpsCalc)0x0) {
    return MPP_OK;
  }
  mpp_spinlock_lock();
  lVar2 = mpp_time();
  lVar1 = *(long *)((long)ctx + 0x28);
  if (lVar1 == 0) {
    *(long *)((long)ctx + 0x20) = lVar2;
    *(long *)((long)ctx + 0x30) = lVar2;
  }
  else {
    lVar5 = lVar2 - *(long *)((long)ctx + 0x30);
    if (999999 < lVar5) {
      lVar4 = lVar2 - *(long *)((long)ctx + 0x20);
      lVar3 = lVar1 - *(long *)((long)ctx + 0x38);
      *(long *)((long)ctx + 0x30) = lVar2;
      *(long *)((long)ctx + 0x38) = lVar1;
      lVar2 = lVar1;
      goto LAB_00109c47;
    }
  }
  lVar2 = 0;
  lVar5 = 0;
  lVar3 = 0;
  lVar4 = 0;
LAB_00109c47:
  *(long *)((long)ctx + 0x28) = lVar1 + 1;
  mpp_spinlock_unlock(ctx);
  if (lVar4 != 0 && *(code **)((long)ctx + 0x18) != (code *)0x0) {
    (**(code **)((long)ctx + 0x18))(lVar4,lVar2,lVar5,lVar3);
  }
  return MPP_OK;
}

Assistant:

MPP_RET fps_calc_inc(FpsCalc ctx)
{
    FpsCalcImpl *impl = (FpsCalcImpl *)ctx;
    RK_S64 total_time = 0;
    RK_S64 total_count = 0;
    RK_S64 last_time = 0;
    RK_S64 last_count = 0;

    if (NULL == impl)
        return MPP_OK;

    mpp_spinlock_lock(&impl->lock);
    {
        RK_S64 now = mpp_time();
        if (!impl->total_count) {
            impl->total_start = now;
            impl->last_start = now;
        } else {
            RK_S64 elapsed = now - impl->last_start;

            // print on each second
            if (elapsed >= 1000000) {
                total_time = now - impl->total_start;
                total_count = impl->total_count;
                last_time = now - impl->last_start;
                last_count = impl->total_count - impl->last_count;

                impl->last_start = now;
                impl->last_count = impl->total_count;
            }
        }

        impl->total_count++;
    }
    mpp_spinlock_unlock(&impl->lock);

    if (impl->callback && total_time)
        impl->callback(total_time, total_count, last_time, last_count);

    return MPP_OK;
}